

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O1

bool wasm::Properties::isSingleConstantExpression(Expression *curr)

{
  bool bVar1;
  byte in_AL;
  uint uVar2;
  
  bVar1 = true;
  if ((curr->_id == RefAsId) && (*(int *)(curr + 1) - 1U < 2)) {
    in_AL = isSingleConstantExpression((Expression *)curr[1].type.id);
    bVar1 = false;
  }
  if (bVar1) {
    in_AL = 1;
    uVar2 = curr->_id - 0x29;
    if (((0x2a < uVar2) || ((0x40000000005U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) &&
       (curr->_id != ConstId)) {
      in_AL = 0;
    }
  }
  return (bool)(in_AL & 1);
}

Assistant:

inline bool isSingleConstantExpression(const Expression* curr) {
  if (auto* refAs = curr->dynCast<RefAs>()) {
    if (refAs->op == ExternConvertAny || refAs->op == AnyConvertExtern) {
      return isSingleConstantExpression(refAs->value);
    }
  }
  return curr->is<Const>() || curr->is<RefNull>() || curr->is<RefFunc>() ||
         curr->is<StringConst>();
}